

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

FFSEncodeVector FFSencode_vector(FFSBuffer b,FMFormat_conflict fmformat,void *data)

{
  int64_t iVar1;
  int iVar2;
  size_t data_offset;
  FFSEncodeVector pFVar3;
  FMFormat_conflict buf;
  size_t tmp_data;
  addr_list_entry stack_addr_list [100];
  internal_iovec stack_iov_array [100];
  encode_state local_1030;
  size_t local_fe0;
  addr_list_entry local_fd8 [100];
  internal_iovec local_998 [100];
  
  local_1030.output_len = 0;
  local_1030.iovec_is_stack = 1;
  local_1030.iovcnt = 0;
  local_1030.iovec = local_998;
  local_1030.malloc_vec_size = 0;
  local_1030.no_leaf_copy = 0;
  local_1030.addr_list_is_stack = 1;
  local_1030.addr_list_cnt = 0;
  local_1030.addr_list = local_fd8;
  local_1030.copy_all = 0;
  local_1030.saved_offset_difference = 0;
  local_1030.orig_data = data;
  make_tmp_buffer(b,0);
  buf = fmformat;
  setup_header(b,fmformat,&local_1030);
  iVar1 = local_1030.output_len;
  local_1030.saved_offset_difference = local_1030.output_len;
  if (local_1030.copy_all == 0 && fmformat->variant == 0) {
    data_offset = add_data_iovec(&local_1030,(FFSBuffer)buf,data,(long)fmformat->record_length,1);
  }
  else {
    data_offset = copy_data_to_tmp(&local_1030,b,data,(long)fmformat->record_length,1,(size_t *)0x0)
    ;
    if (data_offset == 0xffffffffffffffff) {
      return (FFSEncodeVector)0x0;
    }
  }
  if (fmformat->variant != 0) {
    if (fmformat->recursive != 0) {
      local_1030.addr_list[local_1030.addr_list_cnt].addr = data;
      local_1030.addr_list[local_1030.addr_list_cnt].offset = data_offset;
      local_1030.addr_list_cnt = local_1030.addr_list_cnt + 1;
    }
    allocate_tmp_space(&local_1030,b,0,8,&local_fe0);
    iVar2 = handle_subfields(b,fmformat,&local_1030,data_offset);
    if (iVar2 == 0) {
      return (FFSEncodeVector)0x0;
    }
    *(int64_t *)((long)b->tmp_buffer + (long)(fmformat->server_ID).length) =
         local_1030.output_len - iVar1;
    if (local_1030.addr_list_is_stack == 0) {
      free(local_1030.addr_list);
      local_1030.addr_list = (addr_list_entry *)0x0;
    }
  }
  pFVar3 = fixup_output_vector(b,&local_1030);
  return pFVar3;
}

Assistant:

FFSEncodeVector
FFSencode_vector(FFSBuffer b, FMFormat fmformat, void *data)
{
    internal_iovec stack_iov_array[STACK_ARRAY_SIZE];
    addr_list_entry stack_addr_list[STACK_ARRAY_SIZE];
    struct encode_state state;
    init_encode_state(&state);
    ssize_t base_offset = 0;
    ssize_t header_size;

    state.iovec_is_stack = 1;
    state.iovec = stack_iov_array;
    state.addr_list_is_stack = 1;
    state.addr_list = stack_addr_list;
    state.copy_all = 0;
    state.saved_offset_difference = 0;
    state.orig_data = data;

    make_tmp_buffer(b, 0);

    /* setup header information */
    setup_header(b, fmformat, &state);

    header_size = state.output_len;
    state.saved_offset_difference = header_size;

    if (fmformat->variant || state.copy_all) {
	base_offset = copy_data_to_tmp(&state, b, data, 
				       fmformat->record_length, 1, NULL);
	if (base_offset == -1) return NULL;
    } else if (!state.copy_all) {
	base_offset = add_data_iovec(&state, b, data, 
				     fmformat->record_length, 1);
    }
    if (!fmformat->variant) {
	return fixup_output_vector(b, &state);
    }

    if (fmformat->recursive) {
	state.addr_list[state.addr_list_cnt].addr = data;
	state.addr_list[state.addr_list_cnt].offset = base_offset;
	state.addr_list_cnt++;
    }

    copy_data_to_tmp(&state, b, NULL, 0, 8, NULL);   /* force 64-bit align for var */

    if (!handle_subfields(b, fmformat, &state, base_offset)) return NULL;
    {
	/* fill in actual length of data marshalled after header */
	char *tmp_data = b->tmp_buffer;
	int64_t record_len = state.output_len - header_size;
	tmp_data += fmformat->server_ID.length;
	memcpy(tmp_data, &record_len, 8);
    }
    free_addr_list(&state);
    return fixup_output_vector(b, &state);
}